

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void logmsg(char *msg,...)

{
  uint __errnum;
  FILE *whereto;
  char in_AL;
  time_t tVar1;
  uint *puVar2;
  char *pcVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_948 [8];
  undefined8 local_940;
  undefined8 local_938;
  undefined8 local_930;
  undefined8 local_928;
  undefined8 local_920;
  undefined8 local_918;
  undefined8 local_908;
  undefined8 local_8f8;
  undefined8 local_8e8;
  undefined8 local_8d8;
  undefined8 local_8c8;
  undefined8 local_8b8;
  undefined8 local_8a8;
  uint local_88c;
  undefined1 auStack_888 [4];
  int error;
  __suseconds_t local_880;
  char local_878 [8];
  char timebuf [20];
  tm *now;
  time_t sec;
  timeval tv;
  FILE *logfp;
  char buffer [2049];
  undefined1 local_28 [8];
  va_list ap;
  char *msg_local;
  
  if (in_AL != '\0') {
    local_918 = in_XMM0_Qa;
    local_908 = in_XMM1_Qa;
    local_8f8 = in_XMM2_Qa;
    local_8e8 = in_XMM3_Qa;
    local_8d8 = in_XMM4_Qa;
    local_8c8 = in_XMM5_Qa;
    local_8b8 = in_XMM6_Qa;
    local_8a8 = in_XMM7_Qa;
  }
  local_940 = in_RSI;
  local_938 = in_RDX;
  local_930 = in_RCX;
  local_928 = in_R8;
  local_920 = in_R9;
  ap[0].reg_save_area = msg;
  if (serverlogfile == (char *)0x0) {
    curl_mfprintf(_stderr,"Error: serverlogfile not set\n");
  }
  else {
    _auStack_888 = tvnow();
    sec = _auStack_888;
    tv.tv_sec = local_880;
    if (logmsg::known_offset == 0) {
      tVar1 = time((time_t *)0x0);
      logmsg::epoch_offset = tVar1 - sec;
      logmsg::known_offset = 1;
    }
    now = (tm *)(logmsg::epoch_offset + sec);
    register0x00000000 = localtime((time_t *)&now);
    curl_msnprintf(local_878,0x14,"%02d:%02d:%02d.%06ld",(ulong)(uint)register0x00000000->tm_hour,
                   (ulong)(uint)register0x00000000->tm_min,(ulong)(uint)register0x00000000->tm_sec,
                   tv.tv_sec);
    ap[0].overflow_arg_area = local_948;
    ap[0]._0_8_ = &stack0x00000008;
    local_28._4_4_ = 0x30;
    local_28._0_4_ = 8;
    curl_mvsnprintf((char *)&logfp,0x801,(char *)ap[0].reg_save_area,(__va_list_tag *)local_28);
    tv.tv_usec = (__suseconds_t)fopen64(serverlogfile,"ab");
    if ((FILE *)tv.tv_usec == (FILE *)0x0) {
      puVar2 = (uint *)__errno_location();
      whereto = _stderr;
      __errnum = *puVar2;
      local_88c = __errnum;
      pcVar3 = strerror(__errnum);
      curl_mfprintf(whereto,"fopen() failed with error: %d %s\n",(ulong)__errnum,pcVar3);
      curl_mfprintf(_stderr,"Error opening file: %s\n",serverlogfile);
      curl_mfprintf(_stderr,"Msg not logged: %s %s\n",local_878,&logfp);
    }
    else {
      curl_mfprintf((FILE *)tv.tv_usec,"%s %s\n",local_878,&logfp);
      fclose((FILE *)tv.tv_usec);
    }
  }
  return;
}

Assistant:

void logmsg(const char *msg, ...)
{
  va_list ap;
  char buffer[2048 + 1];
  FILE *logfp;
  struct timeval tv;
  time_t sec;
  struct tm *now;
  char timebuf[20];
  static time_t epoch_offset;
  static int    known_offset;

  if(!serverlogfile) {
    fprintf(stderr, "Error: serverlogfile not set\n");
    return;
  }

  tv = tvnow();
  if(!known_offset) {
    epoch_offset = time(NULL) - tv.tv_sec;
    known_offset = 1;
  }
  sec = epoch_offset + tv.tv_sec;
  now = localtime(&sec); /* not thread safe but we don't care */

  msnprintf(timebuf, sizeof(timebuf), "%02d:%02d:%02d.%06ld",
            (int)now->tm_hour, (int)now->tm_min, (int)now->tm_sec,
            (long)tv.tv_usec);

  va_start(ap, msg);
  mvsnprintf(buffer, sizeof(buffer), msg, ap);
  va_end(ap);

  logfp = fopen(serverlogfile, "ab");
  if(logfp) {
    fprintf(logfp, "%s %s\n", timebuf, buffer);
    fclose(logfp);
  }
  else {
    int error = errno;
    fprintf(stderr, "fopen() failed with error: %d %s\n",
            error, strerror(error));
    fprintf(stderr, "Error opening file: %s\n", serverlogfile);
    fprintf(stderr, "Msg not logged: %s %s\n", timebuf, buffer);
  }
}